

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

entity * entitiesLookup(ctmbstr s)

{
  char cVar1;
  int iVar2;
  entity *local_28;
  entity *np;
  tmbchar ch;
  ctmbstr s_local;
  
  if (s == (ctmbstr)0x0) {
    cVar1 = '\0';
  }
  else {
    cVar1 = *s;
  }
  local_28 = entities;
  if (cVar1 != '\0') {
    for (; (local_28->name != (ctmbstr)0x0 && (cVar1 != *local_28->name)); local_28 = local_28 + 1)
    {
    }
    for (; (local_28->name != (ctmbstr)0x0 && (cVar1 == *local_28->name)); local_28 = local_28 + 1)
    {
      iVar2 = prvTidytmbstrcmp(s,local_28->name);
      if (iVar2 == 0) {
        return local_28;
      }
    }
  }
  return (entity *)0x0;
}

Assistant:

static const entity* entitiesLookup( ctmbstr s )
{
    tmbchar ch = (tmbchar)( s ? *s : 0 );
    const entity *np = entities;
    if (ch == 0)
        return NULL;
    while (np->name)
    {
        if (ch == *np->name)
            break;  /* stop when first letter matches */
        np++;
    }
    while (np->name)
    {
        if (ch != *np->name)
            break;  /* stop when first letter does not match */
        if (TY_(tmbstrcmp)(s, np->name) == 0)
            return np;
        np++;
    }
    return NULL;
}